

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

char * __thiscall ImGui::ParseFormatTrimDecorations(ImGui *this,char *fmt,char *buf,int buf_size)

{
  ImGui *pIVar1;
  ImGui IVar2;
  int iVar3;
  undefined4 in_register_0000000c;
  ImGui *pIVar4;
  ImGui *__src;
  
  pIVar1 = (ImGui *)CONCAT44(in_register_0000000c,buf_size);
  __src = this;
  do {
    IVar2 = *__src;
    if (IVar2 == (ImGui)0x0) {
      iVar3 = 3;
      pIVar4 = pIVar1;
    }
    else if ((IVar2 != (ImGui)0x25) || (iVar3 = 1, pIVar4 = __src, __src[1] == (ImGui)0x25)) {
      __src = __src + (ulong)(IVar2 == (ImGui)0x25) + 1;
      iVar3 = 0;
      pIVar4 = pIVar1;
    }
    pIVar1 = pIVar4;
  } while (iVar3 == 0);
  if (iVar3 == 1) {
    __src = pIVar4;
  }
  if (*__src == (ImGui)0x25) {
    pIVar1 = __src + 1;
    IVar2 = *__src;
    pIVar4 = __src;
    if ((IVar2 != (ImGui)0x0) && (IVar2 == (ImGui)0x4c || 0x19 < (byte)((char)IVar2 + 0xbfU))) {
      do {
        pIVar4 = pIVar1;
        if (((byte)((char)IVar2 + 0x9fU) < 0x1a) &&
           ((0x12 < (byte)IVar2 - 0x68 || ((0x49015U >> ((byte)IVar2 - 0x68 & 0x1f) & 1) == 0)))) {
          pIVar1 = pIVar4;
          pIVar4 = pIVar4 + -1;
          goto LAB_0015e772;
        }
        IVar2 = *pIVar4;
      } while ((IVar2 != (ImGui)0x0) &&
              (pIVar1 = pIVar4 + 1, IVar2 == (ImGui)0x4c || 0x19 < (byte)((char)IVar2 + 0xbfU)));
      pIVar1 = pIVar4 + 1;
    }
LAB_0015e772:
    this = __src;
    if (*pIVar1 != (ImGui)0x0) {
      iVar3 = ((int)pIVar4 - (int)__src) + 2;
      if ((int)buf <= iVar3) {
        iVar3 = (int)buf;
      }
      this = (ImGui *)fmt;
      if (iVar3 != 0) {
        strncpy(fmt,(char *)__src,(long)iVar3);
        fmt[(long)iVar3 - 1] = '\0';
      }
    }
  }
  return (char *)this;
}

Assistant:

const char* ImGui::ParseFormatTrimDecorations(const char* fmt, char* buf, int buf_size)
{
    // We don't use strchr() because our strings are usually very short and often start with '%'
    const char* fmt_start = ParseFormatTrimDecorationsLeading(fmt);
    if (fmt_start[0] != '%')
        return fmt;
    fmt = fmt_start;
    while (char c = *fmt++)
    {
        if (c >= 'A' && c <= 'Z' && (c != 'L'))  // L is a type modifier, other letters qualify as types aka end of the format
            break;
        if (c >= 'a' && c <= 'z' && (c != 'h' && c != 'j' && c != 'l' && c != 't' && c != 'w' && c != 'z'))  // h/j/l/t/w/z are type modifiers, other letters qualify as types aka end of the format
            break;
    }
    if (fmt[0] == 0) // If we only have leading decoration, we don't need to copy the data.
        return fmt_start;
    ImStrncpy(buf, fmt_start, ImMin((int)(fmt + 1 - fmt_start), buf_size));
    return buf;
}